

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O0

string * __thiscall
database::Container::name_abi_cxx11_(string *__return_storage_ptr__,Container *this)

{
  Container *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_name);
  return __return_storage_ptr__;
}

Assistant:

std::string database::Container::name() const { return m_name; }